

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::small_vector
          (small_vector<pstore::command_line::literal,_3UL> *this)

{
  literal *local_18;
  small_vector<pstore::command_line::literal,_3UL> *this_local;
  
  this->elements_ = 0;
  local_18 = (this->small_buffer_)._M_elems;
  do {
    memset(local_18,0,0x48);
    command_line::literal::literal(local_18);
    local_18 = local_18 + 1;
  } while (local_18 != (literal *)&this->big_buffer_);
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::vector
            (&this->big_buffer_);
  this->buffer_ = (literal *)0x0;
  set_buffer_ptr(this,this->elements_);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector () noexcept {
        this->set_buffer_ptr (elements_);
    }